

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-sl.cpp
# Opt level: O1

void __thiscall IntVarSL::channel(IntVarSL *this,int val,LitRel val_type,int sign)

{
  Tchar *pTVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  TrailElem local_38;
  
  uVar2 = val_type * 3 ^ sign;
  if (uVar2 < 4) {
    iVar4 = val;
    switch(uVar2) {
    case 0:
      lVar3 = 0x88;
      break;
    case 1:
      lVar3 = 0x80;
      break;
    case 2:
      lVar3 = 0x70;
      iVar4 = val + 1;
      break;
    case 3:
      lVar3 = 0x78;
    }
    (**(code **)((long)(this->el->super_IntVar).super_Var.super_Branching._vptr_Branching + lVar3))
              (this->el,(long)iVar4,0,0);
    if (val_type * 3 == sign) {
      pTVar1 = (this->super_IntVar).vals;
      iVar4 = (this->values).data[(uint)val];
      local_38.pt = (int *)(pTVar1 + iVar4);
      local_38.x = (int)pTVar1[iVar4].v;
      local_38.sz = 1;
      vec<TrailElem>::push(&engine.trail,&local_38);
      pTVar1[iVar4].v = '\0';
    }
    iVar4 = (this->values).data[(uint)(this->el->super_IntVar).min.v];
    local_38.pt = &(this->super_IntVar).min.v;
    local_38.x = (this->super_IntVar).min.v;
    local_38.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_38);
    (this->super_IntVar).min.v = iVar4;
    iVar4 = (this->values).data[(uint)(this->el->super_IntVar).max.v];
    local_38.pt = &(this->super_IntVar).max.v;
    local_38.x = (this->super_IntVar).max.v;
    local_38.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_38);
    (this->super_IntVar).max.v = iVar4;
    return;
  }
  channel();
  printf("min = %d, max = %d, el->min = %d, el->max = %d\n",(ulong)(uint)(this->super_IntVar).min.v,
         (ulong)(uint)(this->super_IntVar).max.v,(ulong)(uint)(this->el->super_IntVar).min.v,
         (ulong)(uint)(this->el->super_IntVar).max.v);
  if ((this->values).sz != 0) {
    uVar5 = 0;
    do {
      printf("%d ",(ulong)(uint)(this->values).data[uVar5]);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->values).sz);
  }
  putchar(10);
  return;
}

Assistant:

void IntVarSL::channel(int val, LitRel val_type, int sign) {
	//	fprintf(stderr, "funny channel\n");
	auto type = static_cast<LitRel>(static_cast<int>(val_type) * 3 ^ sign);
	el->set(val, type, false);
	if (type == 0) {
		vals[values[val]] = 0;
	}
	min = values[el->min];
	max = values[el->max];
}